

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SViewFrustum.h
# Opt level: O2

void __thiscall irr::scene::SViewFrustum::SViewFrustum(SViewFrustum *this,SViewFrustum *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  float fVar10;
  long lVar11;
  
  (this->cameraPosition).X = 0.0;
  (this->cameraPosition).Y = 0.0;
  (this->cameraPosition).Z = 0.0;
  lVar11 = 0xc;
  do {
    core::plane3d<float>::plane3d((plane3d<float> *)((long)this->planes + lVar11 + -0xc));
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x6c);
  (this->boundingBox).MinEdge.X = -1.0;
  (this->boundingBox).MinEdge.Y = -1.0;
  *(undefined8 *)&(this->boundingBox).MinEdge.Z = 0x3f800000bf800000;
  (this->boundingBox).MaxEdge.Y = 1.0;
  (this->boundingBox).MaxEdge.Z = 1.0;
  lVar11 = 0x84;
  do {
    puVar2 = (undefined8 *)((long)&this->planes[1].Normal.Z + lVar11);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined8 *)((long)&this->planes[2].Normal.Z + lVar11) = 0;
    puVar2 = (undefined8 *)((long)&this->planes[0].Normal.Z + lVar11);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2 = (undefined8 *)((long)this->planes + lVar11 + -8);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined4 *)((long)&this->planes[3].Normal.X + lVar11) = 0x3f800000;
    *(undefined4 *)((long)&this->planes[1].D + lVar11) = 0x3f800000;
    *(undefined4 *)((long)&this->planes[0].Normal.Z + lVar11) = 0x3f800000;
    *(undefined4 *)((long)this->planes + lVar11 + -0xc) = 0x3f800000;
    lVar11 = lVar11 + 0x40;
  } while (lVar11 != 0x104);
  (this->BoundingCenter).X = 0.0;
  (this->BoundingCenter).Y = 0.0;
  (this->BoundingCenter).Z = 0.0;
  (this->cameraPosition).Z = (other->cameraPosition).Z;
  fVar10 = (other->cameraPosition).Y;
  (this->cameraPosition).X = (other->cameraPosition).X;
  (this->cameraPosition).Y = fVar10;
  fVar10 = (other->boundingBox).MaxEdge.Z;
  (this->boundingBox).MaxEdge.Y = (other->boundingBox).MaxEdge.Y;
  (this->boundingBox).MaxEdge.Z = fVar10;
  fVar10 = (other->boundingBox).MinEdge.Y;
  uVar3 = *(undefined8 *)&(other->boundingBox).MinEdge.Z;
  (this->boundingBox).MinEdge.X = (other->boundingBox).MinEdge.X;
  (this->boundingBox).MinEdge.Y = fVar10;
  *(undefined8 *)&(this->boundingBox).MinEdge.Z = uVar3;
  for (lVar11 = 0xc; lVar11 != 0x6c; lVar11 = lVar11 + 0x10) {
    puVar2 = (undefined8 *)((long)other->planes + lVar11 + -0xc);
    uVar3 = puVar2[1];
    puVar1 = (undefined8 *)((long)this->planes + lVar11 + -0xc);
    *puVar1 = *puVar2;
    puVar1[1] = uVar3;
  }
  uVar3 = *(undefined8 *)other->Matrices[0].M;
  uVar4 = *(undefined8 *)(other->Matrices[0].M + 2);
  uVar5 = *(undefined8 *)(other->Matrices[0].M + 4);
  uVar6 = *(undefined8 *)(other->Matrices[0].M + 6);
  uVar7 = *(undefined8 *)(other->Matrices[0].M + 8);
  uVar8 = *(undefined8 *)(other->Matrices[0].M + 10);
  uVar9 = *(undefined8 *)(other->Matrices[0].M + 0xe);
  *(undefined8 *)(this->Matrices[0].M + 0xc) = *(undefined8 *)(other->Matrices[0].M + 0xc);
  *(undefined8 *)(this->Matrices[0].M + 0xe) = uVar9;
  *(undefined8 *)(this->Matrices[0].M + 8) = uVar7;
  *(undefined8 *)(this->Matrices[0].M + 10) = uVar8;
  *(undefined8 *)(this->Matrices[0].M + 4) = uVar5;
  *(undefined8 *)(this->Matrices[0].M + 6) = uVar6;
  *(undefined8 *)this->Matrices[0].M = uVar3;
  *(undefined8 *)(this->Matrices[0].M + 2) = uVar4;
  uVar3 = *(undefined8 *)(other->Matrices[1].M + 2);
  uVar4 = *(undefined8 *)(other->Matrices[1].M + 4);
  uVar5 = *(undefined8 *)(other->Matrices[1].M + 6);
  uVar6 = *(undefined8 *)(other->Matrices[1].M + 8);
  uVar7 = *(undefined8 *)(other->Matrices[1].M + 10);
  uVar8 = *(undefined8 *)(other->Matrices[1].M + 0xc);
  uVar9 = *(undefined8 *)(other->Matrices[1].M + 0xe);
  *(undefined8 *)this->Matrices[1].M = *(undefined8 *)other->Matrices[1].M;
  *(undefined8 *)(this->Matrices[1].M + 2) = uVar3;
  *(undefined8 *)(this->Matrices[1].M + 4) = uVar4;
  *(undefined8 *)(this->Matrices[1].M + 6) = uVar5;
  *(undefined8 *)(this->Matrices[1].M + 8) = uVar6;
  *(undefined8 *)(this->Matrices[1].M + 10) = uVar7;
  *(undefined8 *)(this->Matrices[1].M + 0xc) = uVar8;
  *(undefined8 *)(this->Matrices[1].M + 0xe) = uVar9;
  fVar10 = other->FarNearDistance;
  this->BoundingRadius = other->BoundingRadius;
  this->FarNearDistance = fVar10;
  (this->BoundingCenter).Z = (other->BoundingCenter).Z;
  fVar10 = (other->BoundingCenter).Y;
  (this->BoundingCenter).X = (other->BoundingCenter).X;
  (this->BoundingCenter).Y = fVar10;
  return;
}

Assistant:

inline SViewFrustum::SViewFrustum(const SViewFrustum &other)
{
	cameraPosition = other.cameraPosition;
	boundingBox = other.boundingBox;

	u32 i;
	for (i = 0; i < VF_PLANE_COUNT; ++i)
		planes[i] = other.planes[i];

	for (i = 0; i < ETS_COUNT_FRUSTUM; ++i)
		Matrices[i] = other.Matrices[i];

	BoundingRadius = other.BoundingRadius;
	FarNearDistance = other.FarNearDistance;
	BoundingCenter = other.BoundingCenter;
}